

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int fits_translate_keywords
              (fitsfile *infptr,fitsfile *outfptr,int firstkey,char *(*patterns) [2],int npat,
              int n_value,int n_offset,int n_range,int *status)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int nkeys;
  int local_11c;
  int local_118;
  int nkeys1;
  int pat_num;
  int m;
  int n;
  int j;
  int i;
  int nmore;
  fitsfile *local_f8;
  char *(*local_f0) [2];
  char outrec [81];
  char rec [81];
  
  i = 0;
  j = 0;
  n = 0;
  m = 0;
  pat_num = 0;
  iVar2 = *status;
  if (iVar2 < 1) {
    local_11c = npat;
    local_118 = n_value;
    local_f8 = outfptr;
    local_f0 = patterns;
    ffghsp(infptr,&nkeys,&nmore,status);
    iVar2 = *status;
    if ((iVar2 == 0) && (firstkey <= nkeys)) {
      do {
        outrec[0] = '\0';
        ffgrec(infptr,firstkey,rec,status);
        sVar4 = strlen(rec);
        if (8 < (int)(uint)sVar4) {
          uVar7 = 8;
          do {
            if ((byte)(rec[uVar7] + 0x81U) < 0xa1) {
              rec[uVar7] = ' ';
            }
            uVar7 = uVar7 + 1;
          } while (((uint)sVar4 & 0x7fffffff) != uVar7);
        }
        fits_translate_keyword
                  (rec,outrec,local_f0,local_11c,local_118,n_offset,n_range,&pat_num,&i,&j,&m,&n,
                   status);
        iVar8 = firstkey;
        if ((*status == 0) && (outrec[0] != '\0')) {
          if (outrec[0] == '-') {
            outrec[9] = '\0';
            uVar7 = 9;
            do {
              uVar3 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar3;
              if (outrec[uVar7] != ' ') break;
              outrec[uVar7] = '\0';
            } while (2 < uVar3);
            ffxmsg(6,(char *)0x0);
            ffdkey(local_f8,outrec + 1,status);
            if ((*status == 0) && (ffghsp(infptr,&nkeys1,&nmore,status), nkeys1 != nkeys)) {
              firstkey = firstkey + -1;
              nkeys = nkeys1;
            }
            *status = 0;
            lVar5 = (long)ffxmsg::nummsg;
            iVar8 = firstkey;
            if (0 < (long)ffxmsg::nummsg) {
              do {
                lVar6 = lVar5 + -1;
                cVar1 = **(char **)(&DAT_00383898 + lVar5 * 8);
                **(char **)(&DAT_00383898 + lVar5 * 8) = '\0';
                if (lVar5 < 2) break;
                lVar5 = lVar6;
              } while (cVar1 != '\x1b');
              ffxmsg::nummsg = (int)lVar6;
            }
          }
          else {
            ffprec(local_f8,outrec,status);
          }
        }
        rec[8] = '\0';
        outrec[8] = '\0';
        iVar2 = *status;
      } while ((iVar2 == 0) && (firstkey = iVar8 + 1, iVar8 < nkeys));
    }
  }
  return iVar2;
}

Assistant:

int fits_translate_keywords(
	   fitsfile *infptr,   /* I - pointer to input HDU */
	   fitsfile *outfptr,  /* I - pointer to output HDU */
	   int firstkey,       /* I - first HDU record number to start with */
	   char *patterns[][2],/* I - pointer to input / output keyword templates */
	   int npat,           /* I - number of templates passed */
	   int n_value,        /* I - base 'n' template value of interest */
	   int n_offset,       /* I - offset to be applied to the 'n' */
 	                       /*     value in the output string */
	   int n_range,        /* I - controls range of 'n' template */
	                       /*     values of interest (-1,0, or +1) */
           int *status)        /* IO - error status */
/*
     Copy relevant keywords from the table header into the newly
     created primary array header.  Convert names of keywords where
     appropriate.  See fits_translate_keyword() for the definitions.

     Translation begins at header record number 'firstkey', and
     continues to the end of the header.

  This routine was written by Craig Markwardt, GSFC
*/
{
    int nrec, nkeys, nmore;
    char rec[FLEN_CARD];
    int i = 0, j = 0, n = 0, m = 0;
    int pat_num = 0, maxchr, ii;
    char outrec[FLEN_CARD];

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, &nmore, status);  /* get number of keywords */

    for (nrec = firstkey; (*status == 0) && (nrec <= nkeys); nrec++) {
      outrec[0] = '\0';

      ffgrec(infptr, nrec, rec, status);

      /* silently overlook any illegal ASCII characters in the value or */
      /* comment fields of the record. It is usually not appropriate to */
      /* abort the process because of this minor transgression of the FITS rules. */
      /* Set the offending character to a blank */

      maxchr = strlen(rec);
      for (ii = 8; ii < maxchr; ii++)
      {
        if (rec[ii] < 32 || rec[ii] > 126)
          rec[ii] = ' ';
      }
      
      fits_translate_keyword(rec, outrec, patterns, npat, 
			     n_value, n_offset, n_range, 
			     &pat_num, &i, &j, &m, &n, status);
      
      if (*status == 0) {
	if (outrec[0] == '-') { /* prefix -KEYNAME means delete */
	  int i1;

	  /* Preserve only the keyword portion of name */
	  outrec[9] = 0;
	  for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;

	  ffpmrk();
	  ffdkey(outfptr, outrec+1, status); /* delete the keyword */
	  if (*status == 0) {
	    int nkeys1;
	    /* get number of keywords again in case of change*/
	    ffghsp(infptr, &nkeys1, &nmore, status);  
	    if (nkeys1 != nkeys) {
	      nrec --;
	      nkeys = nkeys1;
	    }
	  }
	  *status = 0;
	  ffcmrk();

	} else if (outrec[0]) {
	  ffprec(outfptr, outrec, status); /* copy the keyword */
	}	  
      }
      rec[8] = 0; outrec[8] = 0;

    }	

    return(*status);
}